

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O1

BBox<2> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
          (BBox<2> *__return_storage_ptr__,int param_2,int first,ulong *param_4,undefined8 param_5,
          undefined8 param_6,double init,double param_8,double param_9,double param_10)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Alloc *this;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  BBox<2> c;
  double adStack_88 [4];
  undefined8 local_68;
  undefined8 local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_30;
  double dStack_28;
  double local_20;
  double dStack_18;
  
  this = (Alloc *)*param_4;
  uVar5 = param_4[1];
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    this->use_count = this->use_count + -1;
    this = (Alloc *)(this->size * 8 + 1);
  }
  *param_4 = 0;
  param_4[1] = 0;
  entering_parallel = 0;
  if (param_2 != first) {
    iVar6 = 0;
    iVar7 = param_2;
    do {
      lVar8 = (long)((iVar6 + param_2) * 2);
      adStack_88[2] = *(double *)(uVar5 + lVar8 * 8);
      adStack_88[3] = *(double *)(uVar5 + 8 + lVar8 * 8);
      local_48 = param_9;
      dStack_40 = param_10;
      local_58 = init;
      dStack_50 = param_8;
      local_68 = adStack_88[2];
      local_60 = adStack_88[3];
      lVar8 = 2;
      do {
        dVar2 = adStack_88[lVar8];
        uVar9 = SUB84(dVar2,0);
        uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
        dVar3 = adStack_88[lVar8 + 2];
        uVar11 = SUB84(dVar3,0);
        uVar12 = (undefined4)((ulong)dVar3 >> 0x20);
        dVar4 = adStack_88[lVar8 + 4];
        if (dVar4 <= dVar2) {
          uVar9 = SUB84(dVar4,0);
          uVar10 = (undefined4)((ulong)dVar4 >> 0x20);
        }
        dVar2 = adStack_88[lVar8 + 6];
        if (dVar3 <= dVar2) {
          uVar11 = SUB84(dVar2,0);
          uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        adStack_88[lVar8 + 9] = (double)CONCAT44(uVar10,uVar9);
        adStack_88[lVar8 + 0xb] = (double)CONCAT44(uVar12,uVar11);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 3);
      init = local_30;
      param_8 = dStack_28;
      param_9 = local_20;
      param_10 = dStack_18;
      iVar7 = iVar7 + 1;
      iVar6 = iVar6 + 1;
    } while (iVar7 != first);
  }
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[0] = param_9;
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[1] = param_10;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[0] = init;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[1] = param_8;
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      adStack_88[1] = 1.12856105239689e-317;
      Alloc::~Alloc(this);
      adStack_88[1] = 1.12856747525028e-317;
      operator_delete(this,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}